

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_scriptoperator.cpp
# Opt level: O1

void __thiscall
ScriptOperator_operator_1_Test::~ScriptOperator_operator_1_Test
          (ScriptOperator_operator_1_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(ScriptOperator, operator_1) {
  ScriptOperator script_op = ScriptOperator::OP_1ADD;

  EXPECT_EQ(script_op.GetDataType(), ScriptType::kOp1Add);
  EXPECT_STREQ(script_op.ToString().c_str(), "OP_1ADD");
  EXPECT_FALSE(script_op.Equals(ScriptOperator::OP_XOR));
  EXPECT_TRUE(script_op.Equals(ScriptOperator::OP_1ADD));
  EXPECT_FALSE(script_op.IsPushOperator());
}